

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

void __thiscall
icu_63::NFRule::doFormat
          (NFRule *this,double number,UnicodeString *toInsertInto,int32_t pos,int32_t recursionCount
          ,UErrorCode *status)

{
  UnicodeString *srcText;
  short sVar1;
  NFSubstitution *pNVar2;
  int32_t start;
  int32_t iVar3;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  undefined1 auVar9 [16];
  UnicodeString local_70;
  
  srcText = &this->fRuleText;
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      start = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      start = (int)sVar1 >> 5;
    }
    icu_63::UnicodeString::insert(toInsertInto,pos,srcText);
    iVar7 = 0;
  }
  else {
    start = icu_63::UnicodeString::indexOf(srcText,L"$(",-1,0);
    iVar3 = icu_63::UnicodeString::indexOf(srcText,L")$",-1,start);
    sVar1 = (toInsertInto->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (toInsertInto->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    if (iVar3 < iVar7 + -1) {
      icu_63::UnicodeString::tempSubString(&local_70,srcText,iVar3 + 2,0x7fffffff);
      icu_63::UnicodeString::insert(toInsertInto,pos,&local_70);
      icu_63::UnicodeString::~UnicodeString(&local_70);
    }
    uVar4 = util64_pow(this->radix,this->exponent);
    auVar9._8_4_ = (int)(uVar4 >> 0x20);
    auVar9._0_8_ = uVar4;
    auVar9._12_4_ = 0x45300000;
    dVar8 = (auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    if ((number < 0.0) || (1.0 <= number)) {
      dVar8 = number / dVar8;
    }
    else {
      dVar8 = uprv_round_63(dVar8 * number);
    }
    PluralFormat::format(&local_70,this->rulePatternFormat,(int)dVar8,status);
    icu_63::UnicodeString::insert(toInsertInto,pos,&local_70);
    icu_63::UnicodeString::~UnicodeString(&local_70);
    if (0 < start) {
      icu_63::UnicodeString::tempSubString(&local_70,srcText,0,start);
      icu_63::UnicodeString::insert(toInsertInto,pos,&local_70);
      icu_63::UnicodeString::~UnicodeString(&local_70);
    }
    sVar1 = (this->fRuleText).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar6 = (this->fRuleText).fUnion.fFields.fLength;
    }
    else {
      iVar6 = (int)sVar1 >> 5;
    }
    sVar1 = (toInsertInto->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (toInsertInto->fUnion).fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    iVar7 = (iVar6 + iVar5) - iVar7;
  }
  pNVar2 = this->sub2;
  if (pNVar2 != (NFSubstitution *)0x0) {
    iVar5 = 0;
    if (start < pNVar2->pos) {
      iVar5 = iVar7;
    }
    (*(pNVar2->super_UObject)._vptr_UObject[7])
              (number,pNVar2,toInsertInto,(ulong)(uint)(pos - iVar5),(ulong)(uint)recursionCount,
               status);
  }
  pNVar2 = this->sub1;
  if (pNVar2 != (NFSubstitution *)0x0) {
    iVar5 = 0;
    if (start < pNVar2->pos) {
      iVar5 = iVar7;
    }
    (*(pNVar2->super_UObject)._vptr_UObject[7])
              (number,pNVar2,toInsertInto,(ulong)(uint)(pos - iVar5),(ulong)(uint)recursionCount,
               status);
  }
  return;
}

Assistant:

void
NFRule::doFormat(double number, UnicodeString& toInsertInto, int32_t pos, int32_t recursionCount, UErrorCode& status) const
{
    // first, insert the rule's rule text into toInsertInto at the
    // specified position, then insert the results of the substitutions
    // into the right places in toInsertInto
    // [again, we have two copies of this routine that do the same thing
    // so that we don't sacrifice precision in a long by casting it
    // to a double]
    int32_t pluralRuleStart = fRuleText.length();
    int32_t lengthOffset = 0;
    if (!rulePatternFormat) {
        toInsertInto.insert(pos, fRuleText);
    }
    else {
        pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
        int pluralRuleEnd = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart);
        int initialLength = toInsertInto.length();
        if (pluralRuleEnd < fRuleText.length() - 1) {
            toInsertInto.insert(pos, fRuleText.tempSubString(pluralRuleEnd + 2));
        }
        double pluralVal = number;
        if (0 <= pluralVal && pluralVal < 1) {
            // We're in a fractional rule, and we have to match the NumeratorSubstitution behavior.
            // 2.3 can become 0.2999999999999998 for the fraction due to rounding errors.
            pluralVal = uprv_round(pluralVal * util64_pow(radix, exponent));
        }
        else {
            pluralVal = pluralVal / util64_pow(radix, exponent);
        }
        toInsertInto.insert(pos, rulePatternFormat->format((int32_t)(pluralVal), status));
        if (pluralRuleStart > 0) {
            toInsertInto.insert(pos, fRuleText.tempSubString(0, pluralRuleStart));
        }
        lengthOffset = fRuleText.length() - (toInsertInto.length() - initialLength);
    }

    if (sub2 != NULL) {
        sub2->doSubstitution(number, toInsertInto, pos - (sub2->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
    if (sub1 != NULL) {
        sub1->doSubstitution(number, toInsertInto, pos - (sub1->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
}